

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O1

Vec_Wrd_t * Vec_WrdDup(Vec_Wrd_t *pVec)

{
  int iVar1;
  Vec_Wrd_t *pVVar2;
  word *__dest;
  long lVar3;
  
  pVVar2 = (Vec_Wrd_t *)malloc(0x10);
  iVar1 = pVec->nSize;
  lVar3 = (long)iVar1;
  pVVar2->nSize = iVar1;
  pVVar2->nCap = iVar1;
  if (lVar3 == 0) {
    __dest = (word *)0x0;
  }
  else {
    __dest = (word *)malloc(lVar3 * 8);
  }
  pVVar2->pArray = __dest;
  memcpy(__dest,pVec->pArray,lVar3 << 3);
  return pVVar2;
}

Assistant:

static inline Vec_Wrd_t * Vec_WrdDup( Vec_Wrd_t * pVec )
{
    Vec_Wrd_t * p;
    p = ABC_ALLOC( Vec_Wrd_t, 1 );
    p->nSize  = pVec->nSize;
    p->nCap   = pVec->nSize;
    p->pArray = p->nCap? ABC_ALLOC( word, p->nCap ) : NULL;
    memcpy( p->pArray, pVec->pArray, sizeof(word) * (size_t)pVec->nSize );
    return p;
}